

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

bool SetNameProxy(Proxy *addrProxy)

{
  bool bVar1;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock6;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (addrProxy->m_is_unix_socket == true) {
    bVar1 = IsUnixSocketPath(&addrProxy->m_unix_socket_path);
  }
  else {
    bVar1 = CNetAddr::IsValid((CNetAddr *)addrProxy);
  }
  if (bVar1 != false) {
    local_28._M_device = (mutex_type *)&g_proxyinfo_mutex;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&nameProxy,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)addrProxy);
    nameProxy.proxy.super_CNetAddr.m_net = (addrProxy->proxy).super_CNetAddr.m_net;
    nameProxy.proxy.super_CNetAddr.m_scope_id = (addrProxy->proxy).super_CNetAddr.m_scope_id;
    nameProxy.proxy.port = (addrProxy->proxy).port;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&nameProxy.m_unix_socket_path,&addrProxy->m_unix_socket_path);
    nameProxy.m_is_unix_socket = addrProxy->m_is_unix_socket;
    nameProxy.m_randomize_credentials = addrProxy->m_randomize_credentials;
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool SetNameProxy(const Proxy &addrProxy) {
    if (!addrProxy.IsValid())
        return false;
    LOCK(g_proxyinfo_mutex);
    nameProxy = addrProxy;
    return true;
}